

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

bean_ptr<Person> * __thiscall
hiberlite::Database::manageBean<Person>
          (bean_ptr<Person> *__return_storage_ptr__,Database *this,Person *ptr)

{
  sqlid_t sVar1;
  bean_key local_b0;
  bean_key local_98;
  shared_res<hiberlite::autoclosed_con> local_80;
  undefined1 local_70 [8];
  bean_key key;
  string local_48 [32];
  sqlid_t local_28;
  sqlid_t id;
  Person *ptr_local;
  Database *this_local;
  
  id = (sqlid_t)ptr;
  ptr_local = (Person *)this;
  this_local = (Database *)__return_storage_ptr__;
  getClassName<Person>();
  sVar1 = allocId(this,local_48);
  std::__cxx11::string::~string((string *)local_48);
  local_28 = sVar1;
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_80,&this->con);
  bean_key::bean_key((bean_key *)local_70,&local_80,local_28);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_80);
  bean_key::bean_key(&local_98,(bean_key *)local_70);
  dbUpdate<Person>(&local_98,(Person *)id);
  bean_key::~bean_key(&local_98);
  bean_key::bean_key(&local_b0,(bean_key *)local_70);
  Registry<Person>::createBeanPtr(__return_storage_ptr__,&local_b0,(Person *)id);
  bean_key::~bean_key(&local_b0);
  bean_key::~bean_key((bean_key *)local_70);
  return __return_storage_ptr__;
}

Assistant:

inline bean_ptr<C> Database::manageBean(C* ptr)
{
	sqlid_t id=allocId( Database::getClassName<C>() );
	bean_key key(con,id);
	dbUpdate(key,*ptr);
	return Registry<C>::createBeanPtr(key,ptr);
}